

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.h
# Opt level: O2

Expression __thiscall dynet::RNNBuilder::add_input(RNNBuilder *this,Expression *x)

{
  undefined4 uVar1;
  Expression EVar2;
  
  RNNStateMachine::transition((RNNStateMachine *)(this + 0x10),add_input);
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)(this + 0x18),(value_type_conflict3 *)(this + 8));
  uVar1 = *(undefined4 *)(this + 8);
  *(int *)(this + 8) = (int)((ulong)(*(long *)(this + 0x20) - *(long *)(this + 0x18)) >> 2) + -1;
  EVar2 = (Expression)(**(code **)(*(long *)this + 0x60))(this,uVar1,x);
  return EVar2;
}

Assistant:

Expression add_input(const Expression& x) {
    sm.transition(RNNOp::add_input);
    head.push_back(cur);
    int rcp = cur;
    cur = head.size() - 1;
    return add_input_impl(rcp, x);
  }